

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_NVector_MultiFab.cpp
# Opt level: O1

Real N_VDotProd_MultiFab(N_Vector x,N_Vector y)

{
  MultiFab *x_00;
  Real RVar1;
  
  x_00 = *(MultiFab **)((long)x->content + 8);
  RVar1 = amrex::MultiFab::Dot
                    (x_00,0,*(MultiFab **)((long)y->content + 8),0,
                     (x_00->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp,0,false);
  return RVar1;
}

Assistant:

amrex::Real N_VDotProd_MultiFab(N_Vector x, N_Vector y)
{
    using namespace amrex;

    MultiFab *mf_x = amrex::sundials::getMFptr(x);
    MultiFab *mf_y = amrex::sundials::getMFptr(y);
    sunindextype ncomp = mf_x->nComp();
    //sunindextype nghost = mf_x->nGrow();
    sunindextype nghost = 0;  // do not include ghost cells in dot product

    amrex::Real dotproduct = amrex::MultiFab::Dot(*mf_x, 0, *mf_y, 0, ncomp, nghost);

    return dotproduct;
}